

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmSourceFile * __thiscall cmMakefile::LinearGetSourceFileWithOutput(cmMakefile *this,string *name)

{
  pointer ppcVar1;
  pointer pbVar2;
  pointer ppcVar3;
  cmCustomCommand *pcVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  long lVar6;
  string *output;
  pointer pbVar7;
  cmSourceFile *this_00;
  string out;
  
  out._M_dataplus._M_p = (pointer)&out.field_2;
  out._M_string_length = 0;
  out.field_2._M_local_buf[0] = '\0';
  ppcVar1 = (this->SourceFiles).super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppcVar3 = (this->SourceFiles).
                 super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppcVar3 != ppcVar1; ppcVar3 = ppcVar3 + 1) {
    this_00 = *ppcVar3;
    pcVar4 = cmSourceFile::GetCustomCommand(this_00);
    if (pcVar4 != (cmCustomCommand *)0x0) {
      pcVar4 = cmSourceFile::GetCustomCommand(this_00);
      pvVar5 = cmCustomCommand::GetOutputs_abi_cxx11_(pcVar4);
      pbVar2 = (pvVar5->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar7 = (pvVar5->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar2;
          pbVar7 = pbVar7 + 1) {
        std::__cxx11::string::_M_assign((string *)&out);
        lVar6 = std::__cxx11::string::rfind((string *)&out,(ulong)name);
        if (((lVar6 != -1) && (lVar6 == out._M_string_length - name->_M_string_length)) &&
           ((lVar6 == 0 || (out._M_dataplus._M_p[lVar6 + -1] == '/')))) goto LAB_0019c7e7;
      }
    }
  }
  this_00 = (cmSourceFile *)0x0;
LAB_0019c7e7:
  std::__cxx11::string::~string((string *)&out);
  return this_00;
}

Assistant:

cmSourceFile* cmMakefile::LinearGetSourceFileWithOutput(
  const std::string& name) const
{
  std::string out;

  // look through all the source files that have custom commands
  // and see if the custom command has the passed source file as an output
  for (cmSourceFile* src : this->SourceFiles) {
    // does this source file have a custom command?
    if (src->GetCustomCommand()) {
      // Does the output of the custom command match the source file name?
      const std::vector<std::string>& outputs =
        src->GetCustomCommand()->GetOutputs();
      for (std::string const& output : outputs) {
        out = output;
        std::string::size_type pos = out.rfind(name);
        // If the output matches exactly
        if (pos != std::string::npos && pos == out.size() - name.size() &&
            (pos == 0 || out[pos - 1] == '/')) {
          return src;
        }
      }
    }
  }

  // otherwise return NULL
  return nullptr;
}